

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point.hpp
# Opt level: O3

void std::
     __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>*,std::vector<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>,std::allocator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>>>,__gnu_cxx::__ops::_Val_comp_iter<main::__0>>
               (undefined8 *__last)

{
  ulong uVar1;
  ulong uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  
  uVar3 = *__last;
  uVar4 = __last[1];
  uVar5 = __last[2];
  uVar6 = __last[3];
  uVar1 = __last[4];
  uVar2 = __last[-1];
  while (uVar1 < uVar2) {
    *__last = __last[-5];
    __last[1] = __last[-4];
    __last[2] = __last[-3];
    __last[3] = __last[-2];
    __last[4] = __last[-1];
    uVar2 = __last[-6];
    __last = __last + -5;
  }
  *__last = uVar3;
  __last[1] = uVar4;
  __last[2] = uVar5;
  __last[3] = uVar6;
  __last[4] = uVar1;
  return;
}

Assistant:

point& operator=(const point& rhs){values_ = rhs.values_; return *this;}